

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderLineSegments<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>
               (GetterYs<long_long> *getter1,GetterYRef *getter2,TransformerLinLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_60;
  undefined1 local_58 [8];
  GetterYRef *local_50;
  TransformerLinLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  pIVar11 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
              ((LineSegmentsRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar14 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar14 = getter1->Count;
    }
    if (0 < iVar14) {
      iVar15 = 0;
      dVar8 = 0.0;
      do {
        pIVar12 = GImPlot;
        dVar7 = getter1->X0;
        dVar10 = getter1->XScale;
        iVar4 = getter1->Count;
        dVar6 = log10((double)*(long *)((long)getter1->Ys +
                                       (long)(((getter1->Offset + iVar15) % iVar4 + iVar4) % iVar4)
                                       * (long)getter1->Stride) /
                      GImPlot->CurrentPlot->YAxis[transformer->YAxis].Range.Min);
        pIVar13 = GImPlot;
        iVar4 = transformer->YAxis;
        pIVar5 = pIVar12->CurrentPlot;
        dVar2 = pIVar5->YAxis[iVar4].Range.Min;
        IVar3 = pIVar12->PixelRange[iVar4].Min;
        local_58._4_4_ =
             (float)(pIVar12->My[iVar4] *
                     ((dVar2 + (double)(float)(dVar6 / pIVar12->LogDenY[iVar4]) *
                               (pIVar5->YAxis[iVar4].Range.Max - dVar2)) - dVar2) + (double)IVar3.y)
        ;
        local_58._0_4_ =
             (float)(pIVar12->Mx * ((dVar7 + dVar8 * dVar10) - (pIVar5->XAxis).Range.Min) +
                    (double)IVar3.x);
        dVar10 = getter2->XScale;
        dVar2 = getter2->X0;
        dVar7 = log10(getter2->YRef / GImPlot->CurrentPlot->YAxis[iVar4].Range.Min);
        iVar4 = transformer->YAxis;
        pIVar5 = pIVar13->CurrentPlot;
        dVar6 = pIVar5->YAxis[iVar4].Range.Min;
        IVar3 = pIVar13->PixelRange[iVar4].Min;
        fVar16 = (float)(pIVar13->Mx * ((dVar2 + dVar8 * dVar10) - (pIVar5->XAxis).Range.Min) +
                        (double)IVar3.x);
        fVar17 = (float)(pIVar13->My[iVar4] *
                         ((dVar6 + (double)(float)(dVar7 / pIVar13->LogDenY[iVar4]) *
                                   (pIVar5->YAxis[iVar4].Range.Max - dVar6)) - dVar6) +
                        (double)IVar3.y);
        local_60.y = fVar17;
        local_60.x = fVar16;
        pIVar5 = pIVar11->CurrentPlot;
        fVar9 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar9 = fVar17;
        }
        if ((fVar9 < (pIVar5->PlotRect).Max.y) &&
           (fVar9 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                           local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar5->PlotRect).Min.y, *pfVar1 <= fVar9 && fVar9 != *pfVar1)) {
          fVar9 = (float)local_58._0_4_;
          if (fVar16 <= (float)local_58._0_4_) {
            fVar9 = fVar16;
          }
          if ((fVar9 < (pIVar5->PlotRect).Max.x) &&
             (fVar9 = (float)(-(uint)(fVar16 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar16 <= (float)local_58._0_4_) & (uint)fVar16),
             (pIVar5->PlotRect).Min.x <= fVar9 && fVar9 != (pIVar5->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_60,col,line_weight);
          }
        }
        dVar8 = dVar8 + 1.0;
        iVar15 = iVar15 + 1;
      } while (iVar14 != iVar15);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}